

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O0

Ref<anurbs::Box<3L>_> __thiscall anurbs::Model::get<anurbs::Box<3l>>(Model *this,string *key)

{
  bool bVar1;
  ulong uVar2;
  invalid_argument *this_00;
  out_of_range *this_01;
  pointer pvVar3;
  type *ptVar4;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref<anurbs::Box<3L>_> RVar5;
  Pointer<Entry<Box<3L>_>_> local_58;
  size_type local_48;
  type index;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_true>
  local_38;
  const_iterator it;
  string *key_local;
  Model *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Key is empty");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
               *)&key[1].field_2,in_RDX);
  index = (type)std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                       *)&key[1].field_2);
  bVar1 = std::__detail::operator==
                    (&local_38,
                     (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_true>
                      *)&index);
  if (!bVar1) {
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_false,_true>
                           *)&local_38);
    ptVar4 = std::get<0ul,unsigned_long,unsigned_long>(&pvVar3->second);
    local_48 = *ptVar4;
    std::
    vector<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
    ::at((vector<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
          *)key,local_48);
    std::static_pointer_cast<anurbs::Entry<anurbs::Box<3l>>,anurbs::EntryBase>
              ((shared_ptr<anurbs::EntryBase> *)&local_58);
    Ref<anurbs::Box<3L>_>::Ref((Ref<anurbs::Box<3L>_> *)this,&local_58);
    std::shared_ptr<anurbs::Entry<anurbs::Box<3L>_>_>::~shared_ptr(&local_58);
    RVar5.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Box<3L>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    RVar5.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Box<3L>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (Ref<anurbs::Box<3L>_>)
           RVar5.m_entry.
           super___shared_ptr<anurbs::Entry<anurbs::Box<3L>_>,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_01 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_01,"Entry does not exists");
  __cxa_throw(this_01,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

Ref<TData> get(std::string key) const
    {
        if (key.empty()) {
            throw std::invalid_argument("Key is empty");
        }

        const auto it = m_key_map.find(key);

        if (it == m_key_map.end()) {
            throw std::out_of_range("Entry does not exists");
        }

        const auto index = std::get<0>(it->second);

        return std::static_pointer_cast<Entry<TData>>(
            m_entries.at(index));
    }